

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O3

Error __thiscall
asmjit::RACFGBuilderT<asmjit::x86::RACFGBuilder>::run
          (RACFGBuilderT<asmjit::x86::RACFGBuilder> *this)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint uVar3;
  FuncNode *pFVar4;
  BaseNode *pBVar5;
  void *pvVar6;
  uint8_t uVar7;
  Error EVar8;
  RABlock *pRVar9;
  RABlock *pRVar10;
  Logger *pLVar11;
  undefined8 extraout_RAX;
  byte bVar12;
  uint uVar13;
  InvokeNode *initialNode;
  ulong uVar14;
  ulong uVar15;
  RATiedReg *pRVar16;
  BaseRAPass *pBVar17;
  long lVar18;
  RABlock **item;
  InvokeNode *invokeNode;
  uint64_t uVar19;
  float in_XMM0_Da;
  uint32_t controlType;
  LabelNode *labelNode;
  ZoneVector<asmjit::RABlock_*> blocksWithUnknownJumps;
  RAInstBuilder ib;
  uint32_t local_c9c;
  RABlock **local_c98;
  LabelNode *local_c90;
  ZoneVector<asmjit::RABlock_*> local_c88;
  long local_c78;
  RABlock *local_c70;
  RAInstBuilder local_c68;
  
  if (this->_logger != (Logger *)0x0) {
    Logger::logf(this->_logger,in_XMM0_Da);
  }
  EVar8 = prepare(this);
  if (EVar8 == 0) {
    if ((this->_logger != (Logger *)0x0) &&
       (_logNode(this,(BaseNode *)this->_funcNode,2,(char *)0x0), this->_logger != (Logger *)0x0)) {
      _logBlock(this,this->_curBlock,2);
    }
    item = &this->_curBlock;
    pFVar4 = this->_funcNode;
    invokeNode = (InvokeNode *)
                 ((anon_union_16_2_06f92970_for_BaseNode_0 *)&pFVar4->super_LabelNode)->_links[1];
    if (invokeNode != (InvokeNode *)0x0) {
      local_c70 = this->_curBlock;
      local_c70->_first = (BaseNode *)pFVar4;
      local_c70->_last = (BaseNode *)pFVar4;
      local_c68._cur = local_c68._tiedRegs;
      local_c68._clobbered._masks[0] = 0;
      local_c68._clobbered._masks[1] = 0;
      local_c68._clobbered._masks[2] = 0;
      local_c68._clobbered._masks[3] = 0;
      local_c68._used._masks[0] = 0;
      local_c68._used._masks[1] = 0;
      local_c68._used._masks[2] = 0;
      local_c68._used._masks[3] = 0;
      local_c68._aggregatedFlags = 0;
      local_c68._forbiddenFlags = 0;
      local_c68._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
      local_c68._stats._packed = 0;
      local_c88.super_ZoneVectorBase._data = (void *)0x0;
      local_c88.super_ZoneVectorBase._size = 0;
      local_c88.super_ZoneVectorBase._capacity = 0;
      local_c98 = item;
LAB_00133567:
      do {
        pRVar16 = local_c68._tiedRegs;
        uVar2 = (invokeNode->super_InstNode).super_BaseNode._position;
        if (1 < uVar2 + 1) {
          DebugUtils::assertionFailed
                    ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O3/_deps/asmjit-src/src/asmjit/x86/../x86/../core/rabuilders_p.h"
                     ,0x6f,"node->position() == 0 || node->position() == kNodePositionDidOnBefore");
        }
        initialNode = (InvokeNode *)(invokeNode->super_InstNode).super_BaseNode.field_0._links[1];
        if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeFlags & 0x20) == 0) {
          uVar7 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if (uVar7 == '\x03') {
            pRVar9 = *item;
            pRVar10 = (RABlock *)(invokeNode->super_InstNode).super_BaseNode._passData;
            if (pRVar9 == (RABlock *)0x0) {
              *item = pRVar10;
              if (pRVar10 == (RABlock *)0x0) {
                pRVar10 = BaseRAPass::newBlock(this->_pass,(BaseNode *)invokeNode);
                this->_curBlock = pRVar10;
                if (pRVar10 == (RABlock *)0x0) {
                  return 1;
                }
                (invokeNode->super_InstNode).super_BaseNode._passData = pRVar10;
                uVar13 = pRVar10->_flags;
              }
              else {
                uVar13 = pRVar10->_flags;
                if ((uVar13 & 1) != 0) goto LAB_00133c6f;
              }
              pRVar10->_flags = uVar13 | 4;
              this->_hasCode = false;
              (this->_blockRegStats)._packed = 0;
              EVar8 = BaseRAPass::addBlock(this->_pass,pRVar10);
              if (EVar8 != 0) {
                return EVar8;
              }
              pRVar10 = *local_c98;
            }
            else if (pRVar10 == (RABlock *)0x0) {
              if ((pRVar9 == local_c70 | this->_hasCode) == 1) {
                if ((InvokeNode *)pRVar9->_last == invokeNode) goto LAB_00133d03;
                pRVar9->_last = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar9->_flags = pRVar9->_flags | 0x201;
                (pRVar9->_regsStats)._packed =
                     (pRVar9->_regsStats)._packed | (this->_blockRegStats)._packed;
                pRVar9 = BaseRAPass::newBlock(this->_pass,(BaseNode *)invokeNode);
                if (pRVar9 == (RABlock *)0x0) {
                  return 1;
                }
                *(byte *)&pRVar9->_flags = (byte)pRVar9->_flags | 4;
                EVar8 = RABlock::appendSuccessor(*local_c98,pRVar9);
                if (EVar8 != 0) {
                  return EVar8;
                }
                EVar8 = BaseRAPass::addBlock(this->_pass,pRVar9);
                if (EVar8 != 0) {
                  return EVar8;
                }
                this->_curBlock = pRVar9;
                this->_hasCode = false;
                (this->_blockRegStats)._packed = 0;
              }
              (invokeNode->super_InstNode).super_BaseNode._passData = pRVar9;
              pRVar10 = pRVar9;
            }
            else {
              *(byte *)&pRVar10->_flags = (byte)pRVar10->_flags | 4;
              if (pRVar9 == pRVar10) {
                pRVar10 = pRVar9;
                if (this->_hasCode != false) break;
              }
              else {
                if ((InvokeNode *)pRVar9->_last == invokeNode) {
LAB_00133cfe:
                  run();
LAB_00133d03:
                  run();
                  __clang_call_terminate(extraout_RAX);
                }
                pRVar9->_last = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
                pRVar9->_flags = pRVar9->_flags | 0x201;
                (pRVar9->_regsStats)._packed =
                     (pRVar9->_regsStats)._packed | (this->_blockRegStats)._packed;
                EVar8 = RABlock::appendSuccessor(pRVar9,pRVar10);
                if (EVar8 != 0) {
                  return EVar8;
                }
                EVar8 = BaseRAPass::addBlock(this->_pass,pRVar10);
                if (EVar8 != 0) {
                  return EVar8;
                }
                this->_curBlock = pRVar10;
                this->_hasCode = false;
                (this->_blockRegStats)._packed = 0;
              }
            }
            item = local_c98;
            pLVar11 = this->_logger;
            if ((pRVar10 == (RABlock *)0x0) || (pRVar10 == this->_lastLoggedBlock)) {
LAB_00133b34:
              if (pLVar11 != (Logger *)0x0) {
                _logNode(this,(BaseNode *)invokeNode,2,(char *)0x0);
              }
            }
            else if (pLVar11 != (Logger *)0x0) {
              _logBlock(this,pRVar10,2);
              pLVar11 = this->_logger;
              goto LAB_00133b34;
            }
            if ((invokeNode->super_InstNode)._baseInst._id == this->_exitLabelId) {
              pRVar9 = this->_curBlock;
              pRVar9->_last = (BaseNode *)invokeNode;
              *(byte *)&pRVar9->_flags = (byte)pRVar9->_flags | 1;
              (pRVar9->_regsStats)._packed =
                   (pRVar9->_regsStats)._packed | (this->_blockRegStats)._packed;
              EVar8 = BaseRAPass::addExitBlock(this->_pass,pRVar9);
LAB_0013390f:
              if (EVar8 != 0) {
                return EVar8;
              }
              goto LAB_00133b95;
            }
          }
          else {
            if (this->_logger != (Logger *)0x0) {
              _logNode(this,(BaseNode *)invokeNode,4,(char *)0x0);
              uVar7 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
            }
            if (uVar7 == '\n') {
              if (invokeNode == (InvokeNode *)this->_funcNode->_end) {
                if (*item == (RABlock *)0x0) goto LAB_00133c6f;
                break;
              }
            }
            else if ((uVar7 == '\x10') && (invokeNode != (InvokeNode *)this->_funcNode)) break;
          }
        }
        else {
          if (*item == (RABlock *)0x0) {
            removeNode(this,(BaseNode *)invokeNode);
            invokeNode = initialNode;
            goto LAB_00133567;
          }
          this->_hasCode = true;
          uVar7 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if ((byte)(uVar7 - 0x11) < 2) {
            if (uVar2 == 0xffffffff) {
              (invokeNode->super_InstNode).super_BaseNode._position = 0;
            }
            else {
              pBVar5 = (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
              if (uVar7 == '\x12') {
                EVar8 = x86::RACFGBuilder::onBeforeInvoke((RACFGBuilder *)this,invokeNode);
              }
              else {
                EVar8 = x86::RACFGBuilder::onBeforeRet
                                  ((RACFGBuilder *)this,(FuncRetNode *)invokeNode);
              }
              if (EVar8 != 0) {
                return EVar8;
              }
              if (pBVar5 != (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev) {
                if ((InvokeNode *)(*item)->_first == invokeNode) {
                  (*item)->_first = (pBVar5->field_0).field_0._next;
                }
                (invokeNode->super_InstNode).super_BaseNode._position = 0xffffffff;
                invokeNode = (InvokeNode *)(pBVar5->field_0)._links[1];
                if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeFlags & 0x20) ==
                    0) {
                  run();
                  goto LAB_00133cfe;
                }
              }
              initialNode = (InvokeNode *)
                            (invokeNode->super_InstNode).super_BaseNode.field_0._links[1];
            }
          }
          if (this->_logger != (Logger *)0x0) {
            _logNode(this,(BaseNode *)invokeNode,4,(char *)0x0);
          }
          local_c9c = 0;
          local_c68._aggregatedFlags = 0;
          local_c68._forbiddenFlags = 0;
          local_c68._count.field_0 = (anon_union_4_2_ebeb14a8_for_RARegCount_0)0x0;
          local_c68._stats._packed = 0;
          local_c68._used._masks[0] = 0;
          local_c68._used._masks[1] = 0;
          local_c68._used._masks[2] = 0;
          local_c68._used._masks[3] = 0;
          local_c68._clobbered._masks[0] = 0;
          local_c68._clobbered._masks[1] = 0;
          local_c68._clobbered._masks[2] = 0;
          local_c68._clobbered._masks[3] = 0;
          local_c68._cur = pRVar16;
          EVar8 = x86::RACFGBuilder::onInst
                            ((RACFGBuilder *)this,&invokeNode->super_InstNode,&local_c9c,&local_c68)
          ;
          if (EVar8 != 0) {
            return EVar8;
          }
          uVar7 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          if (uVar7 == '\x12') {
            EVar8 = x86::RACFGBuilder::onInvoke((RACFGBuilder *)this,invokeNode,&local_c68);
            if (EVar8 != 0) {
              return EVar8;
            }
            uVar7 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType;
          }
          if (uVar7 == '\x11') {
            EVar8 = x86::RACFGBuilder::onRet
                              ((RACFGBuilder *)this,(FuncRetNode *)invokeNode,&local_c68);
            if (EVar8 != 0) {
              return EVar8;
            }
            local_c9c = 4;
          }
          else if ((local_c9c == 1) && (pRVar16 != local_c68._cur)) {
            pBVar17 = this->_pass;
            uVar14 = 0;
            do {
              if ((pBVar17->_workRegs).super_ZoneVectorBase._size <= pRVar16->_workId) {
                run();
                goto LAB_00133ccd;
              }
              uVar15 = uVar14;
              if ((*(byte *)(*(long *)((long)(pBVar17->_workRegs).super_ZoneVectorBase._data +
                                      (ulong)pRVar16->_workId * 8) + 0x21) & 0xf) == 0) {
                bVar12 = (pRVar16->field_5).field_0._useId;
                if (bVar12 == 0xff) {
                  uVar15 = (ulong)((int)uVar14 + 1);
                  bVar12 = pBVar17->_scratchRegIndexes[uVar14];
                  (pRVar16->field_5).field_0._useId = bVar12;
                }
                (*item)->_exitScratchGpRegs = (*item)->_exitScratchGpRegs | 1 << (bVar12 & 0x1f);
              }
              pRVar16 = pRVar16 + 1;
              uVar14 = uVar15;
            } while (pRVar16 != local_c68._cur);
          }
          EVar8 = BaseRAPass::assignRAInst
                            (this->_pass,(BaseNode *)invokeNode,this->_curBlock,&local_c68);
          uVar2 = local_c9c;
          if (EVar8 != 0) {
            return EVar8;
          }
          uVar13 = (this->_blockRegStats)._packed | local_c68._stats._packed;
          (this->_blockRegStats)._packed = uVar13;
          if (local_c9c == 0) goto LAB_00133b9c;
          if (2 < local_c9c) {
            if (local_c9c != 4) goto LAB_00133b9c;
            pRVar9 = this->_curBlock;
            pRVar9->_last = (BaseNode *)invokeNode;
            *(byte *)&pRVar9->_flags = (byte)pRVar9->_flags | 1;
            (pRVar9->_regsStats)._packed = (pRVar9->_regsStats)._packed | uVar13;
            EVar8 = RABlock::appendSuccessor(pRVar9,this->_retBlock);
            goto LAB_0013390f;
          }
          pRVar9 = *item;
          pRVar9->_last = (BaseNode *)invokeNode;
          uVar3 = pRVar9->_flags;
          pRVar9->_flags = uVar3 | 0x101;
          (pRVar9->_regsStats)._packed = (pRVar9->_regsStats)._packed | uVar13;
          if (((invokeNode->super_InstNode)._baseInst._options & 2) == 0) {
            bVar12 = (invokeNode->super_InstNode).super_BaseNode.field_1._any._reserved0;
            if (bVar12 == 0) break;
            uVar13 = bVar12 - 1;
            if (((invokeNode->super_InstNode)._opArray[uVar13]._signature & 7) == 4) {
              EVar8 = BaseBuilder::labelNodeOf
                                (&this->_cc->super_BaseBuilder,&local_c90,
                                 (invokeNode->super_InstNode)._opArray[uVar13]._baseId);
              if (EVar8 != 0) {
                return EVar8;
              }
              pRVar9 = BaseRAPass::newBlockOrExistingAt(this->_pass,local_c90,(BaseNode **)0x0);
              if (pRVar9 == (RABlock *)0x0) {
                return 1;
              }
              *(byte *)&pRVar9->_flags = (byte)pRVar9->_flags | 4;
              EVar8 = RABlock::appendSuccessor(*item,pRVar9);
            }
            else {
              pRVar9->_flags = uVar3 | 0x501;
              if (((invokeNode->super_InstNode).super_BaseNode.field_1._any._nodeType == '\x0f') &&
                 (lVar18 = *(long *)&(invokeNode->_funcDetail)._callConv, lVar18 != 0)) {
                uVar19 = this->_pass->_lastTimestamp + 1;
                this->_pass->_lastTimestamp = uVar19;
                uVar13 = *(uint *)(lVar18 + 0x18);
                if ((ulong)uVar13 != 0) {
                  local_c78 = *(long *)(lVar18 + 0x10);
                  lVar18 = 0;
                  do {
                    EVar8 = BaseBuilder::labelNodeOf
                                      (&this->_cc->super_BaseBuilder,&local_c90,
                                       *(uint32_t *)(local_c78 + lVar18));
                    if (EVar8 != 0) {
                      return EVar8;
                    }
                    pRVar9 = BaseRAPass::newBlockOrExistingAt
                                       (this->_pass,local_c90,(BaseNode **)0x0);
                    if (pRVar9 == (RABlock *)0x0) {
                      return 1;
                    }
                    if (pRVar9->_timestamp != uVar19) {
                      pRVar9->_timestamp = uVar19;
                      *(byte *)&pRVar9->_flags = (byte)pRVar9->_flags | 4;
                      EVar8 = RABlock::appendSuccessor(*local_c98,pRVar9);
                      if (EVar8 != 0) {
                        return EVar8;
                      }
                    }
                    lVar18 = lVar18 + 4;
                  } while ((ulong)uVar13 << 2 != lVar18);
                  pRVar9 = *local_c98;
                  item = local_c98;
                }
                EVar8 = shareAssignmentAcrossSuccessors(this,pRVar9);
              }
              else {
                EVar8 = ZoneVector<asmjit::RABlock_*>::append
                                  (&local_c88,&this->_pass->_allocator,item);
              }
            }
            if (EVar8 != 0) {
              return EVar8;
            }
          }
          if (uVar2 != 1) {
            if (initialNode == (InvokeNode *)0x0) break;
            if ((((anon_union_4_4_9308554c_for_BaseNode_2 *)
                 ((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode + 1))->
                _any)._nodeType == '\x03') {
              pRVar9 = *(RABlock **)
                        &((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode)
                         [2].field_0;
              if (pRVar9 == (RABlock *)0x0) {
                pRVar9 = BaseRAPass::newBlock(this->_pass,(BaseNode *)initialNode);
                if (pRVar9 == (RABlock *)0x0) {
                  return 1;
                }
                *(RABlock **)
                 &((anon_union_16_2_06f92970_for_BaseNode_0 *)&initialNode->super_InstNode)[2].
                  field_0 = pRVar9;
              }
            }
            else {
              pRVar9 = BaseRAPass::newBlock(this->_pass,(BaseNode *)initialNode);
              if (pRVar9 == (RABlock *)0x0) {
                return 1;
              }
            }
            pRVar10 = *item;
            puVar1 = &pRVar10->_flags;
            *puVar1 = *puVar1 | 0x200;
            EVar8 = RABlock::prependSuccessor(pRVar10,pRVar9);
            if (EVar8 != 0) {
              return EVar8;
            }
            this->_curBlock = pRVar9;
            this->_hasCode = false;
            (this->_blockRegStats)._packed = 0;
            if ((pRVar9->_flags & 1) != 0) {
LAB_00133c6f:
              pvVar6 = local_c88.super_ZoneVectorBase._data;
              pBVar17 = this->_pass;
              if (pBVar17->_createdBlockCount == (pBVar17->_blocks).super_ZoneVectorBase._size) {
                uVar14 = local_c88.super_ZoneVectorBase._8_8_ & 0xffffffff;
                if (uVar14 != 0) {
                  lVar18 = 0;
                  do {
                    handleBlockWithUnknownJump(this,*(RABlock **)((long)pvVar6 + lVar18));
                    lVar18 = lVar18 + 8;
                  } while (uVar14 << 3 != lVar18);
                  pBVar17 = this->_pass;
                }
                EVar8 = BaseRAPass::initSharedAssignments(pBVar17,&this->_sharedAssignmentsMap);
                return EVar8;
              }
              return 3;
            }
            EVar8 = BaseRAPass::addBlock(this->_pass,pRVar9);
            if (EVar8 != 0) {
              return EVar8;
            }
            invokeNode = initialNode;
            if (this->_logger != (Logger *)0x0) {
              _logBlock(this,this->_curBlock,2);
            }
            goto LAB_00133567;
          }
LAB_00133b95:
          *item = (RABlock *)0x0;
        }
LAB_00133b9c:
        invokeNode = initialNode;
      } while (initialNode != (InvokeNode *)0x0);
    }
LAB_00133ccd:
    EVar8 = 3;
  }
  return EVar8;
}

Assistant:

Error run() noexcept {
    log("[RAPass::BuildCFG]\n");
    ASMJIT_PROPAGATE(prepare());

    logNode(_funcNode, kRootIndentation);
    logBlock(_curBlock, kRootIndentation);

    RABlock* entryBlock = _curBlock;
    BaseNode* node = _funcNode->next();
    if (ASMJIT_UNLIKELY(!node))
      return DebugUtils::errored(kErrorInvalidState);

    _curBlock->setFirst(_funcNode);
    _curBlock->setLast(_funcNode);

    RAInstBuilder ib;
    ZoneVector<RABlock*> blocksWithUnknownJumps;

    for (;;) {
      BaseNode* next = node->next();
      ASMJIT_ASSERT(node->position() == 0 || node->position() == kNodePositionDidOnBefore);

      if (node->isInst()) {
        // Instruction | Jump | Invoke | Return
        // ------------------------------------

        // Handle `InstNode`, `InvokeNode`, and `FuncRetNode`. All of them
        // share the same interface that provides operands that have read/write
        // semantics.
        if (ASMJIT_UNLIKELY(!_curBlock)) {
          // Unreachable code has to be removed, we cannot allocate registers
          // in such code as we cannot do proper liveness analysis in such case.
          removeNode(node);
          node = next;
          continue;
        }

        _hasCode = true;

        if (node->isInvoke() || node->isFuncRet()) {
          if (node->position() != kNodePositionDidOnBefore) {
            // Call and Reg are complicated as they may insert some surrounding
            // code around them. The simplest approach is to get the previous
            // node, call the `onBefore()` handlers and then check whether
            // anything changed and restart if so. By restart we mean that the
            // current `node` would go back to the first possible inserted node
            // by `onBeforeInvoke()` or `onBeforeRet()`.
            BaseNode* prev = node->prev();

            if (node->type() == BaseNode::kNodeInvoke)
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeInvoke(node->as<InvokeNode>()));
            else
              ASMJIT_PROPAGATE(static_cast<This*>(this)->onBeforeRet(node->as<FuncRetNode>()));

            if (prev != node->prev()) {
              // If this was the first node in the block and something was
              // inserted before it then we have to update the first block.
              if (_curBlock->first() == node)
                _curBlock->setFirst(prev->next());

              node->setPosition(kNodePositionDidOnBefore);
              node = prev->next();

              // `onBeforeInvoke()` and `onBeforeRet()` can only insert instructions.
              ASMJIT_ASSERT(node->isInst());
            }

            // Necessary if something was inserted after `node`, but nothing before.
            next = node->next();
          }
          else {
            // Change the position back to its original value.
            node->setPosition(0);
          }
        }

        InstNode* inst = node->as<InstNode>();
        logNode(inst, kCodeIndentation);

        uint32_t controlType = BaseInst::kControlNone;
        ib.reset();
        ASMJIT_PROPAGATE(static_cast<This*>(this)->onInst(inst, controlType, ib));

        if (node->isInvoke()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onInvoke(inst->as<InvokeNode>(), ib));
        }

        if (node->isFuncRet()) {
          ASMJIT_PROPAGATE(static_cast<This*>(this)->onRet(inst->as<FuncRetNode>(), ib));
          controlType = BaseInst::kControlReturn;
        }

        if (controlType == BaseInst::kControlJump) {
          uint32_t fixedRegCount = 0;
          for (RATiedReg& tiedReg : ib) {
            RAWorkReg* workReg = _pass->workRegById(tiedReg.workId());
            if (workReg->group() == BaseReg::kGroupGp) {
              uint32_t useId = tiedReg.useId();
              if (useId == BaseReg::kIdBad) {
                useId = _pass->_scratchRegIndexes[fixedRegCount++];
                tiedReg.setUseId(useId);
              }
              _curBlock->addExitScratchGpRegs(Support::bitMask<uint32_t>(useId));
            }
          }
        }

        ASMJIT_PROPAGATE(_pass->assignRAInst(inst, _curBlock, ib));
        _blockRegStats.combineWith(ib._stats);

        if (controlType != BaseInst::kControlNone) {
          // Support for conditional and unconditional jumps.
          if (controlType == BaseInst::kControlJump || controlType == BaseInst::kControlBranch) {
            _curBlock->setLast(node);
            _curBlock->addFlags(RABlock::kFlagHasTerminator);
            _curBlock->makeConstructed(_blockRegStats);

            if (!(inst->instOptions() & BaseInst::kOptionUnfollow)) {
              // Jmp/Jcc/Call/Loop/etc...
              uint32_t opCount = inst->opCount();
              const Operand* opArray = inst->operands();

              // Cannot jump anywhere without operands.
              if (ASMJIT_UNLIKELY(!opCount))
                return DebugUtils::errored(kErrorInvalidState);

              if (opArray[opCount - 1].isLabel()) {
                // Labels are easy for constructing the control flow.
                LabelNode* labelNode;
                ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, opArray[opCount - 1].as<Label>()));

                RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                if (ASMJIT_UNLIKELY(!targetBlock))
                  return DebugUtils::errored(kErrorOutOfMemory);

                targetBlock->makeTargetable();
                ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
              }
              else {
                // Not a label - could be jump with reg/mem operand, which
                // means that it can go anywhere. Such jumps must either be
                // annotated so the CFG can be properly constructed, otherwise
                // we assume the worst case - can jump to any basic block.
                JumpAnnotation* jumpAnnotation = nullptr;
                _curBlock->addFlags(RABlock::kFlagHasJumpTable);

                if (inst->type() == BaseNode::kNodeJump)
                  jumpAnnotation = inst->as<JumpNode>()->annotation();

                if (jumpAnnotation) {
                  uint64_t timestamp = _pass->nextTimestamp();
                  for (uint32_t id : jumpAnnotation->labelIds()) {
                    LabelNode* labelNode;
                    ASMJIT_PROPAGATE(cc()->labelNodeOf(&labelNode, id));

                    RABlock* targetBlock = _pass->newBlockOrExistingAt(labelNode);
                    if (ASMJIT_UNLIKELY(!targetBlock))
                      return DebugUtils::errored(kErrorOutOfMemory);

                    // Prevents adding basic-block successors multiple times.
                    if (!targetBlock->hasTimestamp(timestamp)) {
                      targetBlock->setTimestamp(timestamp);
                      targetBlock->makeTargetable();
                      ASMJIT_PROPAGATE(_curBlock->appendSuccessor(targetBlock));
                    }
                  }
                  ASMJIT_PROPAGATE(shareAssignmentAcrossSuccessors(_curBlock));
                }
                else {
                  ASMJIT_PROPAGATE(blocksWithUnknownJumps.append(_pass->allocator(), _curBlock));
                }
              }
            }

            if (controlType == BaseInst::kControlJump) {
              // Unconditional jump makes the code after the jump unreachable,
              // which will be removed instantly during the CFG construction;
              // as we cannot allocate registers for instructions that are not
              // part of any block. Of course we can leave these instructions
              // as they are, however, that would only postpone the problem as
              // assemblers can't encode instructions that use virtual registers.
              _curBlock = nullptr;
            }
            else {
              node = next;
              if (ASMJIT_UNLIKELY(!node))
                return DebugUtils::errored(kErrorInvalidState);

              RABlock* consecutiveBlock;
              if (node->type() == BaseNode::kNodeLabel) {
                if (node->hasPassData()) {
                  consecutiveBlock = node->passData<RABlock>();
                }
                else {
                  consecutiveBlock = _pass->newBlock(node);
                  if (ASMJIT_UNLIKELY(!consecutiveBlock))
                    return DebugUtils::errored(kErrorOutOfMemory);
                  node->setPassData<RABlock>(consecutiveBlock);
                }
              }
              else {
                consecutiveBlock = _pass->newBlock(node);
                if (ASMJIT_UNLIKELY(!consecutiveBlock))
                  return DebugUtils::errored(kErrorOutOfMemory);
              }

              _curBlock->addFlags(RABlock::kFlagHasConsecutive);
              ASMJIT_PROPAGATE(_curBlock->prependSuccessor(consecutiveBlock));

              _curBlock = consecutiveBlock;
              _hasCode = false;
              _blockRegStats.reset();

              if (_curBlock->isConstructed())
                break;
              ASMJIT_PROPAGATE(_pass->addBlock(consecutiveBlock));

              logBlock(_curBlock, kRootIndentation);
              continue;
            }
          }

          if (controlType == BaseInst::kControlReturn) {
            _curBlock->setLast(node);
            _curBlock->makeConstructed(_blockRegStats);
            ASMJIT_PROPAGATE(_curBlock->appendSuccessor(_retBlock));

            _curBlock = nullptr;
          }
        }
      }
      else if (node->type() == BaseNode::kNodeLabel) {
        // Label - Basic-Block Management
        // ------------------------------

        if (!_curBlock) {
          // If the current code is unreachable the label makes it reachable
          // again. We may remove the whole block in the future if it's not
          // referenced though.
          _curBlock = node->passData<RABlock>();

          if (_curBlock) {
            // If the label has a block assigned we can either continue with
            // it or skip it if the block has been constructed already.
            if (_curBlock->isConstructed())
              break;
          }
          else {
            // No block assigned - create a new one and assign it.
            _curBlock = _pass->newBlock(node);
            if (ASMJIT_UNLIKELY(!_curBlock))
              return DebugUtils::errored(kErrorOutOfMemory);
            node->setPassData<RABlock>(_curBlock);
          }

          _curBlock->makeTargetable();
          _hasCode = false;
          _blockRegStats.reset();
          ASMJIT_PROPAGATE(_pass->addBlock(_curBlock));
        }
        else {
          if (node->hasPassData()) {
            RABlock* consecutive = node->passData<RABlock>();
            consecutive->makeTargetable();

            if (_curBlock == consecutive) {
              // The label currently processed is part of the current block. This
              // is only possible for multiple labels that are right next to each
              // other or labels that are separated by non-code nodes like directives
              // and comments.
              if (ASMJIT_UNLIKELY(_hasCode))
                return DebugUtils::errored(kErrorInvalidState);
            }
            else {
              // Label makes the current block constructed. There is a chance that the
              // Label is not used, but we don't know that at this point. In the worst
              // case there would be two blocks next to each other, it's just fine.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlock::kFlagHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }
          }
          else {
            // First time we see this label.
            if (_hasCode || _curBlock == entryBlock) {
              // Cannot continue the current block if it already contains some
              // code or it's a block entry. We need to create a new block and
              // make it a successor.
              ASMJIT_ASSERT(_curBlock->last() != node);
              _curBlock->setLast(node->prev());
              _curBlock->addFlags(RABlock::kFlagHasConsecutive);
              _curBlock->makeConstructed(_blockRegStats);

              RABlock* consecutive = _pass->newBlock(node);
              if (ASMJIT_UNLIKELY(!consecutive))
                return DebugUtils::errored(kErrorOutOfMemory);
              consecutive->makeTargetable();

              ASMJIT_PROPAGATE(_curBlock->appendSuccessor(consecutive));
              ASMJIT_PROPAGATE(_pass->addBlock(consecutive));

              _curBlock = consecutive;
              _hasCode = false;
              _blockRegStats.reset();
            }

            node->setPassData<RABlock>(_curBlock);
          }
        }

        if (_curBlock && _curBlock != _lastLoggedBlock)
          logBlock(_curBlock, kRootIndentation);
        logNode(node, kRootIndentation);

        // Unlikely: Assume that the exit label is reached only once per function.
        if (ASMJIT_UNLIKELY(node->as<LabelNode>()->labelId() == _exitLabelId)) {
          _curBlock->setLast(node);
          _curBlock->makeConstructed(_blockRegStats);
          ASMJIT_PROPAGATE(_pass->addExitBlock(_curBlock));

          _curBlock = nullptr;
        }
      }
      else {
        // Other Nodes | Function Exit
        // ---------------------------

        logNode(node, kCodeIndentation);

        if (node->type() == BaseNode::kNodeSentinel) {
          if (node == _funcNode->endNode()) {
            // Make sure we didn't flow here if this is the end of the function sentinel.
            if (ASMJIT_UNLIKELY(_curBlock))
              return DebugUtils::errored(kErrorInvalidState);
            break;
          }
        }
        else if (node->type() == BaseNode::kNodeFunc) {
          // RAPass can only compile a single function at a time. If we
          // encountered a function it must be the current one, bail if not.
          if (ASMJIT_UNLIKELY(node != _funcNode))
            return DebugUtils::errored(kErrorInvalidState);
          // PASS if this is the first node.
        }
        else {
          // PASS if this is a non-interesting or unknown node.
        }
      }

      // Advance to the next node.
      node = next;

      // NOTE: We cannot encounter a NULL node, because every function must be
      // terminated by a sentinel (`stop`) node. If we encountered a NULL node it
      // means that something went wrong and this node list is corrupted; bail in
      // such case.
      if (ASMJIT_UNLIKELY(!node))
        return DebugUtils::errored(kErrorInvalidState);
    }

    if (_pass->hasDanglingBlocks())
      return DebugUtils::errored(kErrorInvalidState);

    for (RABlock* block : blocksWithUnknownJumps)
      handleBlockWithUnknownJump(block);

    return _pass->initSharedAssignments(_sharedAssignmentsMap);
  }